

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_entries.cpp
# Opt level: O1

void __thiscall ot::commissioner::persistent_storage::Network::Network(Network *this)

{
  char *__end;
  DomainId local_70;
  NetworkId local_6c;
  string local_68;
  string local_48;
  
  local_6c.mId = 0xffffffff;
  local_70.mId = 0xffffffff;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"","");
  Network(this,&local_6c,&local_70,&local_68,0,0,0,&local_48,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

Network::Network()
    : Network(EMPTY_ID, EMPTY_ID, "", 0, 0, 0, "", -1)
{
}